

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

parasail_matrix_t * parasail_matrix_from_file_internal(char *filename,int case_sensitive)

{
  char cVar1;
  ushort uVar2;
  long lVar3;
  ushort *puVar4;
  size_t sVar5;
  int iVar6;
  parasail_file_t *pf;
  long lVar7;
  int *piVar8;
  size_t sVar9;
  __int32_t **pp_Var10;
  parasail_matrix_t *ppVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  byte bVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  size_t sStack_c0;
  int *local_b0;
  int *local_a8;
  ulong local_a0;
  int *local_98;
  size_t local_88;
  int local_7c;
  int local_78;
  int val;
  size_t local_70;
  char *local_68;
  size_t local_60;
  size_t local_58;
  ulong local_50;
  int local_48;
  char local_42 [10];
  ushort **local_38;
  
  if (filename == (char *)0x0) {
    fwrite("parasail_matrix_from_file: NULL pointer\n",0x28,1,_stderr);
    return (parasail_matrix_t *)0x0;
  }
  pf = parasail_open(filename);
  if (pf == (parasail_file_t *)0x0) {
    fprintf(_stderr,"parasail_matrix_from_file: parasail_open(%s) failed\n",filename);
    return (parasail_matrix_t *)0x0;
  }
  lVar3 = pf->size;
  pcVar13 = pf->buf;
  local_78 = 0x7fffffff;
  local_7c = -0x80000000;
  bVar18 = true;
  local_a8 = (int *)0x0;
  local_b0 = (int *)0x0;
  local_70 = 0;
  local_58 = 0;
  local_60 = 0;
  local_88 = 0;
  local_50 = 0;
  local_a0 = 0;
  local_98 = (int *)0x0;
  lVar17 = 0;
  local_68 = filename;
  local_48 = case_sensitive;
  while (lVar17 < lVar3) {
    bVar15 = pcVar13[lVar17];
    uVar16 = (ulong)(char)bVar15;
    if (uVar16 == 0x23) {
      lVar7 = skip_line(pcVar13,lVar17);
    }
    else {
      local_38 = __ctype_b_loc();
      sVar5 = local_58;
      puVar4 = *local_38;
      uVar2 = puVar4[uVar16];
      if ((uVar2 & 8) == 0) {
        if (0x2d < bVar15) {
LAB_00442302:
          if ((uVar2 >> 0xe & 1) == 0) {
            pcVar13 = "parasail_matrix_from_file: non-printing character in matrix file (\'%d\')\n";
          }
          else {
            pcVar13 = "parasail_matrix_from_file: non-alpha character in matrix file (\'%c\')\n";
          }
          fprintf(_stderr,pcVar13,uVar16 & 0xffffffff);
          free(local_a8);
          free(local_b0);
          free(local_98);
          parasail_close(pf);
          return (parasail_matrix_t *)0x0;
        }
        uVar12 = (ulong)(uint)bVar15;
        lVar7 = lVar17;
        if ((0x2400UL >> (uVar12 & 0x3f) & 1) == 0) {
          if ((0x100000200U >> (uVar12 & 0x3f) & 1) == 0) {
            if ((0x240000000000U >> (uVar12 & 0x3f) & 1) == 0) goto LAB_00442302;
            goto LAB_00441c05;
          }
        }
        else {
          lVar14 = lVar17 + 1;
          if (((lVar14 < lVar3) && (lVar7 = lVar14, pcVar13[lVar14] != '\r')) &&
             (pcVar13[lVar14] != '\n')) {
            lVar7 = lVar17;
          }
        }
      }
      else {
LAB_00441c05:
        if (bVar18) {
          lVar14 = 0;
          for (lVar7 = lVar17; lVar7 < lVar3; lVar7 = lVar7 + 1) {
            bVar15 = pcVar13[lVar7];
            uVar16 = (ulong)bVar15;
            if (uVar16 < 0x24) {
              if ((0x100000200U >> (uVar16 & 0x3f) & 1) == 0) {
                if ((0x800002400U >> (uVar16 & 0x3f) & 1) == 0) goto LAB_00441c43;
                break;
              }
            }
            else {
LAB_00441c43:
              if ((bVar15 != 0x2a) && ((puVar4[(char)bVar15] & 0x400) == 0)) goto LAB_0044223f;
              lVar14 = lVar14 + 1;
            }
          }
          if (lVar14 != 0) {
            local_98 = (int *)malloc(lVar14 + 1);
            if (local_98 != (int *)0x0) {
              lVar14 = 0;
              for (lVar7 = lVar17; lVar7 < lVar3; lVar7 = lVar7 + 1) {
                bVar15 = pcVar13[lVar7];
                uVar16 = (ulong)bVar15;
                if (uVar16 < 0x24) {
                  if ((0x100000200U >> (uVar16 & 0x3f) & 1) == 0) {
                    if ((0x800002400U >> (uVar16 & 0x3f) & 1) == 0) goto LAB_00441cad;
                    break;
                  }
                }
                else {
LAB_00441cad:
                  if ((bVar15 != 0x2a) && ((puVar4[(char)bVar15] & 0x400) == 0)) goto LAB_0044223f;
                  *(byte *)((long)local_98 + lVar14) = bVar15;
                  lVar14 = lVar14 + 1;
                }
              }
              *(char *)((long)local_98 + lVar14) = '\0';
              local_88 = strlen((char *)local_98);
              local_50 = local_88 * local_88;
              piVar8 = (int *)malloc(local_50 * 4);
              if (piVar8 == (int *)0x0) {
                perror("malloc");
                fwrite("parasail_matrix_from_file: cannont malloc buffer for matrix\n",0x3c,1,
                       _stderr);
              }
              else {
                local_b0 = (int *)malloc(local_88 + 1);
                if (local_b0 != (int *)0x0) {
                  lVar7 = skip_line(pcVar13,lVar17);
                  local_a8 = local_98;
                  uVar16 = local_a0;
                  local_98 = piVar8;
                  local_58 = local_88;
                  goto LAB_00441d36;
                }
                perror("malloc");
                fwrite("parasail_matrix_from_file: cannont malloc buffer for matrix alphabet\n",0x45
                       ,1,_stderr);
                free(piVar8);
              }
LAB_00441f5b:
              free(local_98);
              goto LAB_00441f60;
            }
            perror("malloc");
          }
LAB_0044223f:
          fwrite("parasail_matrix_from_file: poorly formed matrix file alphabet\n",0x3e,1,_stderr);
LAB_00441f60:
          parasail_close(pf);
          return (parasail_matrix_t *)0x0;
        }
        if (local_58 <= local_70) {
          local_b0 = (int *)realloc(local_b0,local_58 * 2 + 1);
          if (local_b0 == (int *)0x0) {
            perror("realloc");
            fwrite("parasail_matrix_from_file: couldn\'t grow query size\n",0x34,1,_stderr);
            free(local_a8);
            goto LAB_00441f5b;
          }
          local_58 = sVar5 * 2;
          bVar15 = pcVar13[lVar17];
          uVar2 = (*local_38)[(char)bVar15];
        }
        local_60 = local_60 + 1;
        bVar18 = bVar15 == 0x2a;
        if ((uVar2 >> 10 & 1) == 0) {
          bVar15 = 0x2a;
        }
        lVar7 = lVar17 + (ulong)(bVar18 | (byte)(uVar2 >> 10) & 1);
        *(byte *)((long)local_b0 + local_70) = bVar15;
        local_70 = local_70 + 1;
        uVar16 = local_88 + local_a0;
        while (local_a0 != uVar16) {
          val = 0;
          for (; (cVar1 = pcVar13[lVar7], cVar1 == ' ' || (cVar1 == '\t')); lVar7 = lVar7 + 1) {
          }
          puVar4 = *local_38;
          if ((cVar1 != '-') && ((puVar4[cVar1] & 0x800) == 0)) {
LAB_00441f25:
            fwrite("parasail_matrix_from_file: poorly formed matrix file\n",0x35,1,_stderr);
            free(local_a8);
            local_a8 = local_b0;
LAB_00441f53:
            free(local_a8);
            goto LAB_00441f5b;
          }
          lVar17 = 1;
          while( true ) {
            local_42[0] = cVar1;
            if (lVar17 == 10) goto LAB_00441f25;
            if ((*(byte *)((long)puVar4 + (long)pcVar13[lVar17 + lVar7] * 2 + 1) & 8) == 0) break;
            local_42[lVar17] = pcVar13[lVar17 + lVar7];
            lVar17 = lVar17 + 1;
          }
          local_42[lVar17] = '\0';
          iVar6 = __isoc99_sscanf(local_42,"%d",&val);
          uVar12 = local_50;
          if (iVar6 != 1) goto LAB_00441f25;
          if (local_50 <= local_a0) {
            local_98 = (int *)realloc(local_98,local_50 * 8);
            if (local_98 != (int *)0x0) {
              local_50 = uVar12 * 2;
              goto LAB_00441eb6;
            }
            perror("realloc");
            fwrite("parasail_matrix_from_file: couldn\'t grow matrix size\n",0x35,1,_stderr);
            local_98 = local_b0;
            goto LAB_00441f53;
          }
LAB_00441eb6:
          lVar7 = lVar7 + lVar17;
          local_98[local_a0] = val;
          local_a0 = local_a0 + 1;
          if (local_7c < val) {
            local_7c = val;
          }
          if (val < local_78) {
            local_78 = val;
          }
        }
LAB_00441d36:
        local_a0 = uVar16;
        bVar18 = false;
      }
    }
    lVar17 = lVar7 + 1;
  }
  parasail_close(pf);
  sVar5 = local_70;
  *(undefined1 *)((long)local_b0 + local_70) = 0;
  if ((local_88 == local_70) && (iVar6 = strcmp((char *)local_a8,(char *)local_b0), iVar6 == 0)) {
    if (local_a0 == sVar5 * sVar5) {
      iVar6 = 0;
      if (local_60 == sVar5) goto LAB_00441fcd;
      pcVar13 = "parasail_matrix_from_file: matrix is missing rows\n";
      sStack_c0 = 0x32;
      goto LAB_00442148;
    }
  }
  else if (local_a0 == local_88 * local_60) {
    iVar6 = 1;
LAB_00441fcd:
    sVar5 = local_60;
    piVar8 = (int *)malloc(0x400);
    if (piVar8 == (int *)0x0) {
      perror("malloc");
      fprintf(_stderr,
              "parasail_matrix_from_file: cannont malloc mapper buffer for matrix file `%s\'\n",
              local_68);
      free(local_a8);
      free(local_b0);
    }
    else {
      parasail_memset_int(piVar8,(int)local_88 + -1,0x100);
      if (local_48 == 0) {
        for (sVar9 = 0; local_88 != sVar9; sVar9 = sVar9 + 1) {
          pp_Var10 = __ctype_toupper_loc();
          piVar8[(*pp_Var10)[*(byte *)((long)local_a8 + sVar9)]] = (int)sVar9;
          pp_Var10 = __ctype_tolower_loc();
          piVar8[(*pp_Var10)[*(byte *)((long)local_a8 + sVar9)]] = (int)sVar9;
        }
      }
      else {
        for (sVar9 = 0; local_88 != sVar9; sVar9 = sVar9 + 1) {
          piVar8[*(byte *)((long)local_a8 + sVar9)] = (int)sVar9;
        }
      }
      ppVar11 = (parasail_matrix_t *)malloc(0x48);
      if (ppVar11 != (parasail_matrix_t *)0x0) {
        ppVar11->name = local_68;
        ppVar11->matrix = local_98;
        ppVar11->mapper = piVar8;
        ppVar11->size = (int)local_88;
        ppVar11->max = local_7c;
        ppVar11->min = local_78;
        ppVar11->user_matrix = local_98;
        ppVar11->type = iVar6;
        ppVar11->length = (int)sVar5;
        ppVar11->alphabet = (char *)local_a8;
        ppVar11->query = (char *)local_b0;
        return ppVar11;
      }
      perror("malloc");
      fprintf(_stderr,"parasail_matrix_from_file: cannont malloc buffer for matrix file `%s\'\n",
              local_68);
    }
    free(local_98);
    return (parasail_matrix_t *)0x0;
  }
  pcVar13 = "parasail_matrix_from_file: matrix is missing values\n";
  sStack_c0 = 0x34;
LAB_00442148:
  fwrite(pcVar13,sStack_c0,1,_stderr);
  free(local_a8);
  free(local_b0);
  free(local_98);
  return (parasail_matrix_t *)0x0;
}

Assistant:

static parasail_matrix_t* parasail_matrix_from_file_internal(const char *filename, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    size_t matrix_i = 0;
    size_t matrix_capacity = 0;
    int *mapper = NULL;
    char *alphabet = NULL;
    char *alphabet_query = NULL;
    size_t alphabet_query_i = 0;
    size_t alphabet_query_capacity = 0;
    parasail_file_t *pf = NULL;
    const char *T = NULL;
    off_t i = 0;
    off_t size = 0;
    int first_alpha = 1;
    size_t count = 0;
    size_t asize = 0;
    int max = INT_MIN;
    int min = INT_MAX;
    size_t c = 0;
    int type = PARASAIL_MATRIX_TYPE_SQUARE;

    if (NULL == filename) {
        fprintf(stderr, "parasail_matrix_from_file: NULL pointer\n");
        return NULL;
    }

    pf = parasail_open(filename);
    if (NULL == pf) {
        fprintf(stderr, "parasail_matrix_from_file: "
                "parasail_open(%s) failed\n", filename);
        return NULL;
    }
    T = pf->buf;
    size = pf->size;

    while (i<size) {
        if (T[i] == '#') {
            /* ignore comments */
            i = skip_line(T, i);
        }
        else if (isalnum(T[i]) || T[i] == '*' || T[i] == '-') {
            if (first_alpha) {
                first_alpha = 0;
                alphabet = get_alphabet(T, i, size);
                if (NULL == alphabet) {
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "poorly formed matrix file alphabet\n");
                    parasail_close(pf);
                    return NULL;
                }
                asize = strlen(alphabet);
                matrix_capacity = asize*asize;
                matrix = (int*)malloc(sizeof(int)*matrix_capacity);
                if (NULL == matrix) {
                    perror("malloc");
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "cannont malloc buffer for matrix\n");
                    free(alphabet);
                    parasail_close(pf);
                    return NULL;
                }
                alphabet_query_capacity = asize;
                alphabet_query = (char*)malloc(sizeof(char)*(alphabet_query_capacity+1));
                if (NULL == alphabet_query) {
                    perror("malloc");
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "cannont malloc buffer for matrix alphabet\n");
                    free(matrix);
                    free(alphabet);
                    parasail_close(pf);
                    return NULL;
                }
                i = skip_line(T, i);
            }
            else {
                size_t j=0;
                /* store the letter */
                if (alphabet_query_i >= alphabet_query_capacity) {
                    alphabet_query_capacity *= 2;
                    alphabet_query = realloc(alphabet_query, sizeof(char)*(alphabet_query_capacity+1));
                    if (NULL == alphabet_query) {
                        perror("realloc");
                        fprintf(stderr, "parasail_matrix_from_file: "
                                "couldn't grow query size\n");
                        if (alphabet) free(alphabet);
                        if (alphabet_query) free(alphabet_query);
                        if (matrix) free(matrix);
                        parasail_close(pf);
                        return NULL;
                    }
                }
                ++count;
                /* allow PSSM matrix to omit query */
                if (isalpha(T[i]) || T[i] == '*') {
                    alphabet_query[alphabet_query_i++] = T[i];
                    ++i; /* skip over the letter */
                }
                else {
                    alphabet_query[alphabet_query_i++] = '*';
                    /* don't increment read index i */
                }
                for (j=0; j<asize; ++j) {
                    int val = 0;
                    int retcode = get_num(T, &i, &val);
                    if (-1 == retcode) {
                        fprintf(stderr, "parasail_matrix_from_file: "
                                "poorly formed matrix file\n");
                        if (alphabet) free(alphabet);
                        if (alphabet_query) free(alphabet_query);
                        if (matrix) free(matrix);
                        parasail_close(pf);
                        return NULL;
                    }
                    if (matrix_i >= matrix_capacity) {
                        matrix_capacity *= 2;
                        matrix = realloc(matrix, sizeof(int)*matrix_capacity);
                        if (NULL == matrix) {
                            perror("realloc");
                            fprintf(stderr, "parasail_matrix_from_file: "
                                    "couldn't grow matrix size\n");
                            if (alphabet) free(alphabet);
                            if (alphabet_query) free(alphabet_query);
                            if (matrix) free(matrix);
                            parasail_close(pf);
                            return NULL;
                        }
                    }
                    matrix[matrix_i++] = val;
                    max = val > max ? val : max;
                    min = val < min ? val : min;
                }
            }
        }
        else if (T[i] == '\n' || T[i] == '\r') {
            /* ignore newline */
            /* for the case of "\r\n" or "\n\r" */
            if (i+1<size && (T[i+1] == '\n' || T[i+1] == '\r')) {
                ++i;
            }
        }
        else if (T[i] == ' ' || T[i] == '\t') {
            /* ignore spaces and tabs */
        }
        else if (isprint(T[i])) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "non-alpha character in matrix file ('%c')\n", T[i]);
            if (alphabet) free(alphabet);
            if (alphabet_query) free(alphabet_query);
            if (matrix) free(matrix);
            parasail_close(pf);
            return NULL;
        }
        else {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "non-printing character in matrix file ('%d')\n", T[i]);
            if (alphabet) free(alphabet);
            if (alphabet_query) free(alphabet_query);
            if (matrix) free(matrix);
            parasail_close(pf);
            return NULL;
        }
        ++i;
    }

    parasail_close(pf);

    /* we consider this a square matrix if alphabet sizes match and are identical */
    alphabet_query[alphabet_query_i] = '\0';
    if (asize == alphabet_query_i && 0 == strcmp(alphabet, alphabet_query)) {
        /* square */
        if (matrix_i != asize*asize) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing values\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
        if (count != asize) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing rows\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
    }
    else {
        /* PSSM */
        type = PARASAIL_MATRIX_TYPE_PSSM;
        if (matrix_i != asize*count) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing values\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
    }

    mapper = (int*)malloc(sizeof(int)*256);
    if (NULL == mapper) {
        perror("malloc");
        fprintf(stderr, "parasail_matrix_from_file: "
                "cannont malloc mapper buffer for matrix file `%s'\n",
                filename);
        free(alphabet);
        free(alphabet_query);
        free(matrix);
        return NULL;
    }
    parasail_memset_int(mapper, asize-1, 256);
    if (case_sensitive) {
        for (c=0; c<asize; ++c) {
            mapper[(unsigned char)alphabet[c]] = (int)c;
        }
    }
    else {
        for (c=0; c<asize; ++c) {
            mapper[toupper((unsigned char)alphabet[c])] = (int)c;
            mapper[tolower((unsigned char)alphabet[c])] = (int)c;
        }
    }

    retval = (parasail_matrix_t*)malloc(sizeof(parasail_matrix_t));
    if (NULL == retval) {
        perror("malloc");
        fprintf(stderr, "parasail_matrix_from_file: "
                "cannont malloc buffer for matrix file `%s'\n", filename);
        free(matrix);
        return NULL;
    }

    retval->name = filename;
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)asize;
    retval->max = max;
    retval->min = min;
    retval->user_matrix = matrix;
    retval->type = type;
    retval->length = (int)count;
    retval->alphabet = alphabet;
    retval->query = alphabet_query;
    return retval;
}